

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learner.h
# Opt level: O1

void LEARNER::multiline_learn_or_predict<true>
               (multi_learner *base,multi_ex *examples,uint64_t offset,uint32_t id)

{
  int iVar1;
  pointer ppeVar2;
  pointer ppeVar3;
  ulong uVar4;
  multi_ex *__range2;
  uint64_t *puVar5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> saved_offsets;
  void *local_58;
  unsigned_long *puStack_50;
  unsigned_long *local_48;
  multi_learner *local_38;
  
  local_58 = (void *)0x0;
  puStack_50 = (unsigned_long *)0x0;
  local_48 = (unsigned_long *)0x0;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start; local_38 = base, ppeVar3 != ppeVar2;
      ppeVar3 = ppeVar3 + 1) {
    puVar5 = &((*ppeVar3)->super_example_predict).ft_offset;
    if (puStack_50 == local_48) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_58,
                 (iterator)puStack_50,puVar5);
    }
    else {
      *puStack_50 = *puVar5;
      puStack_50 = puStack_50 + 1;
    }
    *puVar5 = offset;
    base = local_38;
  }
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar3 != ppeVar2) {
    iVar1 = *(int *)(base + 0xe0);
    do {
      puVar5 = &((*ppeVar3)->super_example_predict).ft_offset;
      *puVar5 = *puVar5 + (ulong)(iVar1 * id);
      ppeVar3 = ppeVar3 + 1;
    } while (ppeVar3 != ppeVar2);
  }
  (**(code **)(base + 0x28))(*(undefined8 *)(base + 0x18),*(undefined8 *)(base + 0x20),examples);
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppeVar2 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppeVar3 != ppeVar2) {
    iVar1 = *(int *)(base + 0xe0);
    do {
      puVar5 = &((*ppeVar3)->super_example_predict).ft_offset;
      *puVar5 = *puVar5 - (ulong)(id * iVar1);
      ppeVar3 = ppeVar3 + 1;
    } while (ppeVar3 != ppeVar2);
  }
  ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
      super__Vector_impl_data._M_finish != ppeVar3) {
    uVar4 = 0;
    do {
      (ppeVar3[uVar4]->super_example_predict).ft_offset = *(uint64_t *)((long)local_58 + uVar4 * 8);
      uVar4 = uVar4 + 1;
      ppeVar3 = (examples->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(examples->
                                   super__Vector_base<example_*,_std::allocator<example_*>_>).
                                   _M_impl.super__Vector_impl_data._M_finish - (long)ppeVar3 >> 3));
  }
  if (local_58 != (void *)0x0) {
    operator_delete(local_58);
  }
  return;
}

Assistant:

void multiline_learn_or_predict(multi_learner& base, multi_ex& examples, const uint64_t offset, const uint32_t id = 0)
{
  std::vector<uint64_t> saved_offsets;
  for (auto ec : examples)
  {
    saved_offsets.push_back(ec->ft_offset);
    ec->ft_offset = offset;
  }

  if (is_learn)
    base.learn(examples, id);
  else
    base.predict(examples, id);

  for (size_t i = 0; i < examples.size(); i++) examples[i]->ft_offset = saved_offsets[i];
}